

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# karatsubaMultiplication.cpp
# Opt level: O1

Num * __thiscall
karatsubaMultiplication::multiply
          (Num *__return_storage_ptr__,karatsubaMultiplication *this,Num *n1,Num *n2)

{
  Num *pNVar1;
  bool bVar2;
  uint uVar3;
  Short SVar4;
  Short length;
  Short SVar5;
  Short SVar6;
  uint uVar7;
  ulong uVar8;
  uint __uval;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  Num tk1;
  Num b_b;
  string str_t;
  Num t_2m;
  Num a_a;
  Num x1;
  Num tk2;
  Halves a;
  Halves b;
  Num x3;
  Num x2;
  Num local_2a8;
  undefined1 local_280 [16];
  size_type local_270 [3];
  string local_258;
  Num local_238;
  undefined1 local_210 [40];
  Halves local_1e8;
  Num local_198;
  pair<Num,_Num> local_170;
  pair<Num,_Num> local_120;
  Num local_d0;
  Num local_a8;
  Num local_80;
  Num local_58;
  
  SVar4 = Num::getSize(n1);
  length = Num::getSize(n2);
  if (length < SVar4) {
    length = SVar4;
  }
  SVar4 = Num::getSize(n1);
  if ((SVar4 == 1) || (SVar4 = Num::getSize(n2), SVar4 == 1)) {
    gradeSchoolMultiplication::gradeSchoolMultiplication((gradeSchoolMultiplication *)&local_170);
    gradeSchoolMultiplication::multiply
              (__return_storage_ptr__,(gradeSchoolMultiplication *)&local_170,n1,n2);
    gradeSchoolMultiplication::~gradeSchoolMultiplication((gradeSchoolMultiplication *)&local_170);
    return __return_storage_ptr__;
  }
  std::pair<Num,_Num>::pair<Num,_Num,_true>(&local_170);
  std::pair<Num,_Num>::pair<Num,_Num,_true>(&local_120);
  Num::getHalf(&local_1e8,n1,length);
  Num::operator=(&local_170.first,&local_1e8.first);
  pNVar1 = &local_170.second;
  Num::operator=(pNVar1,&local_1e8.second);
  Num::~Num(&local_1e8.second);
  Num::~Num(&local_1e8.first);
  Num::getHalf(&local_1e8,n2,length);
  Num::operator=(&local_120.first,&local_1e8.first);
  Num::operator=(&local_120.second,&local_1e8.second);
  Num::~Num(&local_1e8.second);
  Num::~Num(&local_1e8.first);
  Num::Num(&local_1e8.first);
  Num::Num(&local_a8);
  Num::Num(&local_d0);
  multiply((Num *)local_210,this,&local_170.first,&local_120.first);
  Num::operator=(&local_1e8.first,(Num *)local_210);
  Num::~Num((Num *)local_210);
  Num::Num((Num *)local_210);
  SVar4 = Num::getNumber(&local_170.first);
  SVar5 = Num::getNumber(pNVar1);
  Num::operator+((Num *)local_280,&local_170.first,pNVar1);
  local_210._0_2_ = Num::getSize((Num *)local_280);
  uVar9 = (uint)SVar5 + (uint)SVar4;
  Num::~Num((Num *)local_280);
  uVar11 = 1;
  if (9 < uVar9) {
    uVar10 = uVar9;
    uVar3 = 4;
    do {
      uVar11 = uVar3;
      if (uVar10 < 100) {
        uVar11 = uVar11 - 2;
        goto LAB_001042ca;
      }
      if (uVar10 < 1000) {
        uVar11 = uVar11 - 1;
        goto LAB_001042ca;
      }
      if (uVar10 < 10000) goto LAB_001042ca;
      bVar2 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      uVar3 = uVar11 + 4;
    } while (bVar2);
    uVar11 = uVar11 + 1;
  }
LAB_001042ca:
  local_280._0_8_ = local_270;
  std::__cxx11::string::_M_construct((ulong)local_280,(char)uVar11);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_280._0_8_,uVar11,uVar9);
  std::__cxx11::string::operator=((string *)(local_210 + 8),(string *)local_280);
  if ((size_type *)local_280._0_8_ != local_270) {
    operator_delete((void *)local_280._0_8_,local_270[0] + 1);
  }
  Num::Num((Num *)local_280);
  SVar4 = Num::getNumber(&local_120.first);
  SVar5 = Num::getNumber(&local_120.second);
  Num::operator+(&local_2a8,&local_120.first,&local_120.second);
  SVar6 = Num::getSize(&local_2a8);
  uVar9 = (uint)SVar5 + (uint)SVar4;
  local_280._0_2_ = SVar6;
  Num::~Num(&local_2a8);
  uVar11 = 1;
  if (9 < uVar9) {
    uVar10 = uVar9;
    uVar3 = 4;
    do {
      uVar11 = uVar3;
      if (uVar10 < 100) {
        uVar11 = uVar11 - 2;
        goto LAB_001043d9;
      }
      if (uVar10 < 1000) {
        uVar11 = uVar11 - 1;
        goto LAB_001043d9;
      }
      if (uVar10 < 10000) goto LAB_001043d9;
      bVar2 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      uVar3 = uVar11 + 4;
    } while (bVar2);
    uVar11 = uVar11 + 1;
  }
LAB_001043d9:
  local_2a8._0_8_ = (long)&local_2a8 + 0x10U;
  std::__cxx11::string::_M_construct((ulong)&local_2a8,(char)uVar11);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_2a8._0_8_,uVar11,uVar9);
  std::__cxx11::string::operator=((string *)(local_280 + 8),(string *)&local_2a8);
  if (local_2a8._0_8_ != (long)&local_2a8 + 0x10U) {
    operator_delete((void *)local_2a8._0_8_,local_2a8.base._M_string_length + 1);
  }
  pNVar1 = &local_170.second;
  Num::operator+(&local_238,&local_170.first,pNVar1);
  Num::operator+(&local_198,&local_120.first,&local_120.second);
  multiply(&local_2a8,this,&local_238,&local_198);
  Num::operator=(&local_a8,&local_2a8);
  Num::~Num(&local_2a8);
  Num::~Num(&local_198);
  Num::~Num(&local_238);
  multiply(&local_2a8,this,pNVar1,&local_120.second);
  Num::operator=(&local_d0,&local_2a8);
  Num::~Num(&local_2a8);
  SVar4 = Num::getNumber(&local_a8);
  SVar5 = Num::getNumber(&local_1e8.first);
  SVar6 = Num::getNumber(&local_d0);
  uVar11 = (uint)SVar4 - ((uint)SVar6 + (uint)SVar5);
  uVar9 = -uVar11;
  if (0 < (int)uVar11) {
    uVar9 = uVar11;
  }
  uVar10 = 1;
  if (9 < uVar9) {
    uVar8 = (ulong)uVar9;
    uVar3 = 4;
    do {
      uVar10 = uVar3;
      uVar7 = (uint)uVar8;
      if (uVar7 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_00104588;
      }
      if (uVar7 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_00104588;
      }
      if (uVar7 < 10000) goto LAB_00104588;
      uVar8 = uVar8 / 10000;
      uVar3 = uVar10 + 4;
    } while (99999 < uVar7);
    uVar10 = uVar10 + 1;
  }
LAB_00104588:
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_258,(char)uVar10 - (char)((int)uVar11 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_258._M_dataplus._M_p + (uVar11 >> 0x1f),uVar10,uVar9);
  Num::multiplyByPowerOfTen(&local_2a8,&local_1e8.first,length);
  Num::Num(&local_238,&local_258,(Short)local_258._M_string_length);
  Num::multiplyByPowerOfTen(&local_198,&local_238,length >> 1);
  Num::multiplyByPowerOfTen(&local_80,&local_238,length >> 1);
  Num::operator+(&local_58,&local_2a8,&local_80);
  Num::operator+(__return_storage_ptr__,&local_58,&local_d0);
  Num::~Num(&local_58);
  Num::~Num(&local_80);
  Num::~Num(&local_198);
  Num::~Num(&local_238);
  Num::~Num(&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  Num::~Num((Num *)local_280);
  Num::~Num((Num *)local_210);
  Num::~Num(&local_d0);
  Num::~Num(&local_a8);
  Num::~Num(&local_1e8.first);
  Num::~Num(&local_120.second);
  Num::~Num(&local_120.first);
  Num::~Num(pNVar1);
  Num::~Num(&local_170.first);
  return __return_storage_ptr__;
}

Assistant:

Num karatsubaMultiplication :: multiply(const Num& n1, const Num& n2)
{
    Short m = std::max(n1.getSize(), n2.getSize());
    if (n1.getSize() == 1 || n2.getSize()== 1)
    {
        gradeSchoolMultiplication t;
        return t.multiply(n1, n2);
    }

    Halves a, b;
    a = n1.getHalf(m);
    b = n2.getHalf(m);

    Num x1, x2, x3;
    x1 = karatsubaMultiplication ::multiply(a.first, b.first);
    Num a_a;
    int per = a.first.getNumber() + a.second.getNumber();
    a_a.size = (a.first + a.second).getSize();
    a_a.base = std::to_string(per);

    Num b_b;
    int per1 = b.first.getNumber() + b.second.getNumber();
    b_b.size = (b.first + b.second).getSize();
    b_b.base = std::to_string(per1);

    x2 = karatsubaMultiplication ::multiply(a.first + a.second, b.first + b.second);
    x3 = karatsubaMultiplication ::multiply(a.second, b.second);

    int t_x2 = x2.getNumber() - x1.getNumber() - x3.getNumber();

    std::string str_t = std::to_string(t_x2);


    Num tk1 = x1.multiplyByPowerOfTen(m);
    Num t_2m (str_t, str_t.size());

    if (m % 2)
    {
        --m;
    }

    Num tk2 = t_2m.multiplyByPowerOfTen(m/2);

    Num x4 =  tk1 + (t_2m).multiplyByPowerOfTen(m / 2) + x3;

    return x4;
}